

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O2

void __thiscall pbrt::MeasuredBRDF::MeasuredBRDF(MeasuredBRDF *this,Allocator alloc)

{
  PiecewiseLinear2D<0UL>::PiecewiseLinear2D(&this->ndf,alloc);
  PiecewiseLinear2D<0UL>::PiecewiseLinear2D(&this->sigma,alloc);
  PiecewiseLinear2D<2UL>::PiecewiseLinear2D(&this->vndf,alloc);
  PiecewiseLinear2D<2UL>::PiecewiseLinear2D(&this->luminance,alloc);
  PiecewiseLinear2D<3UL>::PiecewiseLinear2D(&this->spectra,alloc);
  (this->wavelengths).alloc.memoryResource = alloc.memoryResource;
  (this->wavelengths).nStored = 0;
  (this->wavelengths).ptr = (float *)0x0;
  (this->wavelengths).nAlloc = 0;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

MeasuredBRDF(Allocator alloc)
        : ndf(alloc),
          sigma(alloc),
          vndf(alloc),
          luminance(alloc),
          spectra(alloc),
          wavelengths(alloc) {}